

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

rel_iterator * __thiscall dg::vr::ValueRelations::end_related(ValueRelations *this,V param_2)

{
  RelatedValueIterator *in_RDI;
  ValueRelations *in_stack_ffffffffffffffd8;
  
  RelatedValueIterator::RelatedValueIterator(in_RDI,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

ValueRelations::rel_iterator ValueRelations::end_related(V /*val*/) const {
    return rel_iterator(*this);
}